

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int attr_list_subset(attr_list l1,attr_list l2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int index;
  int index_00;
  attr l2_tmp;
  attr l1_tmp;
  
  iVar1 = attr_count(l1);
  iVar2 = attr_count(l2);
  iVar3 = 0;
  if (iVar1 <= iVar2) {
    iVar3 = 1;
    for (index = 0; (iVar3 != 0 && (index < iVar1)); index = index + 1) {
      get_pattr(l1,index,&l1_tmp.attr_id,&l1_tmp.val_type,&l1_tmp.value);
      iVar3 = 0;
      for (index_00 = 0; (iVar3 == 0 && (index_00 < iVar2)); index_00 = index_00 + 1) {
        get_pattr(l2,index_00,&l2_tmp.attr_id,&l2_tmp.val_type,&l2_tmp.value);
        iVar3 = compare_attr_p_by_val(&l1_tmp,&l2_tmp);
      }
    }
  }
  return iVar3;
}

Assistant:

extern
int
attr_list_subset (attr_list l1, attr_list l2)
{
  /*
   *  This function returns true if l1 is a subset of l2.  I
   *  define this as:  for each element of l1, there is an element
   *  of l2 with the same attribute name, attribute type, and attribute
   *  value.
   */
  int i, j, keep_going = 1;
  int l1_count;
  int l2_count;
  attr l1_tmp, l2_tmp;

  l1_count = attr_count (l1);
  l2_count = attr_count (l2);
  
  if (l2_count < l1_count) return 0;

  for (i = 0; i < l1_count && keep_going; i++)
    {
      int found = 0;
      get_pattr (l1, i, &l1_tmp.attr_id, &l1_tmp.val_type, &l1_tmp.value);

      for (j = 0; !found && j < l2_count; j++)
	{
	    get_pattr (l2, j, &l2_tmp.attr_id, &l2_tmp.val_type,
		      &l2_tmp.value);
	  
	  found = compare_attr_p_by_val (&l1_tmp, &l2_tmp);
	}

      keep_going = found;
    }

  return keep_going;
}